

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Bitmask exprTableUsage(WhereMaskSet *pMaskSet,Expr *p)

{
  Bitmask BVar1;
  Bitmask BVar2;
  ulong uVar3;
  long lVar4;
  
  if (p != (Expr *)0x0) {
    if (p->op != 0x98) {
      BVar1 = exprTableUsage(pMaskSet,p->pRight);
      BVar2 = exprTableUsage(pMaskSet,p->pLeft);
      if ((p->flags & 0x800) == 0) {
        uVar3 = exprListTableUsage(pMaskSet,(p->x).pList);
      }
      else {
        uVar3 = exprSelectTableUsage(pMaskSet,(Select *)(p->x).pList);
      }
      return BVar2 | BVar1 | uVar3;
    }
    if (0 < (long)pMaskSet->n) {
      lVar4 = 0;
      do {
        if (pMaskSet->ix[lVar4] == p->iTable) {
          return 1L << ((byte)lVar4 & 0x3f);
        }
        lVar4 = lVar4 + 1;
      } while (pMaskSet->n != lVar4);
      return 0;
    }
  }
  return 0;
}

Assistant:

static Bitmask exprTableUsage(WhereMaskSet *pMaskSet, Expr *p){
  Bitmask mask = 0;
  if( p==0 ) return 0;
  if( p->op==TK_COLUMN ){
    mask = getMask(pMaskSet, p->iTable);
    return mask;
  }
  mask = exprTableUsage(pMaskSet, p->pRight);
  mask |= exprTableUsage(pMaskSet, p->pLeft);
  if( ExprHasProperty(p, EP_xIsSelect) ){
    mask |= exprSelectTableUsage(pMaskSet, p->x.pSelect);
  }else{
    mask |= exprListTableUsage(pMaskSet, p->x.pList);
  }
  return mask;
}